

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetInternals::ComputeLinkImplementationLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,
          OptionalLinkImplementation *impl,cmTarget *head)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  int iVar2;
  PolicyStatus PVar3;
  LinkLibraryType LVar4;
  char *pcVar5;
  ostream *poVar6;
  cmake *this_00;
  _Rb_tree_node_base *p_Var7;
  cmTarget *pcVar8;
  pointer ppVar9;
  PolicyID id;
  pointer pcVar10;
  string *item;
  MessageType t;
  pointer item_00;
  bool bVar11;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string name;
  cmGeneratorExpression ge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  string evaluated;
  ostringstream e;
  cmGeneratorExpressionDAGChecker dagChecker;
  auto_ptr<cmCompiledGeneratorExpression> local_338;
  OptionalLinkImplementation *local_330;
  pointer local_328;
  string local_320;
  string *local_300;
  string *local_2f8;
  string local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  string local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_290;
  pointer local_288;
  cmTarget *local_280;
  PolicyMap *local_278;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_270;
  cmListFileBacktrace *local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [360];
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_a0;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> local_68 [2];
  
  pcVar10 = (this->LinkImplementationPropertyEntries).
            super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_288 = (this->LinkImplementationPropertyEntries).
              super__Vector_base<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_330 = impl;
  local_300 = config;
  local_280 = head;
  if (pcVar10 != local_288) {
    local_2f8 = &thisTarget->Name;
    local_278 = &thisTarget->PolicyMap;
    local_270 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&thisTarget->LinkImplicitNullProperties;
    local_290 = &thisTarget->MaxLanguageStandards;
    do {
      local_2d0._8_8_ = (string *)0x0;
      aStack_2c0._M_allocated_capacity = 0;
      aStack_2c0._8_8_ = 0;
      local_250._8_6_ = 0x534549524152;
      local_250[0] = 'L';
      local_250._1_5_ = 0x4c5f4b4e49;
      local_250._6_2_ = 0x4249;
      local_260._8_8_ = 0xe;
      local_250[0xe] = '\0';
      local_328 = pcVar10;
      local_260._0_8_ = (cmCompiledGeneratorExpression *)local_250;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_e8,local_2f8,(string *)local_260,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((cmCompiledGeneratorExpression *)local_260._0_8_ !=
          (cmCompiledGeneratorExpression *)local_250) {
        operator_delete((void *)local_260._0_8_,
                        CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
      }
      local_268 = &local_328->Backtrace;
      cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_2d0,local_268);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_260,(string *)local_2d0);
      local_338.x_ = (cmCompiledGeneratorExpression *)local_260._0_8_;
      local_260._0_8_ = (pointer)0x0;
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_260);
      local_260._0_8_ = local_250;
      local_260._8_8_ = 0;
      local_250[0] = '\0';
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         (local_338.x_,thisTarget->Makefile,local_300,false,local_280,
                          (cmGeneratorExpressionDAGChecker *)local_e8,(string *)local_260);
      std::__cxx11::string::string((string *)&local_2b0,pcVar5,(allocator *)&local_2f0);
      if ((undefined1 *)local_260._0_8_ != local_250) {
        operator_delete((void *)local_260._0_8_,
                        CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
      }
      cmSystemTools::ExpandListArgument
                (&local_2b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_2d0 + 8),false);
      if ((local_338.x_)->HadHeadSensitiveCondition == true) {
        local_330->HadHeadSensitiveCondition = true;
      }
      item = (string *)local_2d0._8_8_;
      if (local_2d0._8_8_ != aStack_2c0._M_allocated_capacity) {
        do {
          cmTarget::CheckCMP0004(&local_2f0,thisTarget,item);
          if (local_2f0._M_string_length == (thisTarget->Name)._M_string_length) {
            if ((local_2f0._M_string_length == 0) ||
               (iVar2 = bcmp(local_2f0._M_dataplus._M_p,(local_2f8->_M_dataplus)._M_p,
                             local_2f0._M_string_length), iVar2 == 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
              PVar3 = cmPolicies::PolicyMap::Get(local_278,CMP0038);
              if (PVar3 == OLD) {
LAB_0036ff36:
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
                std::ios_base::~ios_base((ios_base *)(local_250 + 0x60));
                goto LAB_0036ff57;
              }
              if (PVar3 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_320,(cmPolicies *)0x26,id);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_260,local_320._M_dataplus._M_p,
                                    local_320._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  local_320.field_2._M_allocated_capacity + 1);
                }
                bVar11 = false;
                t = AUTHOR_WARNING;
              }
              else {
                t = FATAL_ERROR;
                bVar11 = true;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"Target \"",8)
              ;
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_260,(thisTarget->Name)._M_dataplus._M_p,
                                  (thisTarget->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" links to itself.",0x12);
              this_00 = cmMakefile::GetCMakeInstance(thisTarget->Makefile);
              std::__cxx11::stringbuf::str();
              cmake::IssueMessage(this_00,t,&local_320,&((thisTarget->Internal).Pointer)->Backtrace)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              if (!bVar11) goto LAB_0036ff36;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
              std::ios_base::~ios_base((ios_base *)(local_250 + 0x60));
              iVar2 = 1;
              goto LAB_0036ff5d;
            }
LAB_0036fe11:
            pcVar8 = cmTarget::FindTargetToLink(thisTarget,&local_2f0);
            bVar11 = true;
            if (local_2b0._M_string_length == (local_328->Value)._M_string_length) {
              if (local_2b0._M_string_length == 0) {
                bVar11 = false;
              }
              else {
                iVar2 = bcmp(local_2b0._M_dataplus._M_p,(local_328->Value)._M_dataplus._M_p,
                             local_2b0._M_string_length);
                bVar11 = iVar2 != 0;
              }
            }
            cmLinkImplItem::cmLinkImplItem
                      ((cmLinkImplItem *)local_260,&local_2f0,pcVar8,local_268,bVar11);
            std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
            emplace_back<cmLinkImplItem>
                      ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_330,
                       (cmLinkImplItem *)local_260);
            std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                      ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                       (local_250 + 0x18));
            if ((undefined1 *)local_260._0_8_ != local_250) {
              operator_delete((void *)local_260._0_8_,
                              CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
            }
            iVar2 = 0;
            bVar11 = true;
          }
          else {
            if (local_2f0._M_string_length != 0) goto LAB_0036fe11;
LAB_0036ff57:
            iVar2 = 7;
LAB_0036ff5d:
            bVar11 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((iVar2 != 7) && (iVar2 != 0)) goto LAB_00370075;
          item = item + 1;
        } while (item != (string *)aStack_2c0._M_allocated_capacity);
      }
      psVar1 = &(local_338.x_)->SeenTargetProperties;
      for (p_Var7 = ((local_338.x_)->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        pcVar5 = cmTarget::GetProperty(thisTarget,(string *)(p_Var7 + 1),thisTarget->Makefile);
        if (pcVar5 == (char *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var7 + 1));
        }
      }
      bVar11 = true;
      cmCompiledGeneratorExpression::GetMaxLanguageStandard(local_338.x_,thisTarget,local_290);
LAB_00370075:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_338);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_2d0);
      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector(local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_p != &local_b0) {
        operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._8_8_ != &local_d0) {
        operator_delete((void *)local_e8._8_8_,local_d0._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d0 + 8));
      if (!bVar11) {
        return;
      }
      pcVar10 = local_328 + 1;
    } while (pcVar10 != local_288);
  }
  LVar4 = cmTarget::ComputeLinkType(thisTarget,local_300);
  item_00 = (thisTarget->OriginalLinkLibraries).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = (thisTarget->OriginalLinkLibraries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (item_00 != ppVar9) {
    local_330 = (OptionalLinkImplementation *)
                &(local_330->super_LinkImplementation).super_LinkImplementationLibraries.
                 WrongConfigLibraries;
    do {
      if ((item_00->second != GENERAL) && (item_00->second != LVar4)) {
        cmTarget::CheckCMP0004((string *)local_e8,thisTarget,&item_00->first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._8_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(thisTarget->Name)._M_string_length) {
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8._8_8_ !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) &&
             (iVar2 = bcmp((void *)local_e8._0_8_,(thisTarget->Name)._M_dataplus._M_p,local_e8._8_8_
                          ), iVar2 != 0)) {
LAB_003701e1:
            pcVar8 = cmTarget::FindTargetToLink(thisTarget,(string *)local_e8);
            local_260._0_8_ = local_250;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_260,local_e8._0_8_,(char *)(local_e8._8_8_ + local_e8._0_8_))
            ;
            local_250._16_8_ = pcVar8;
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_330,
                       (cmLinkItem *)local_260);
            if ((undefined1 *)local_260._0_8_ != local_250) {
              operator_delete((void *)local_260._0_8_,
                              CONCAT26(local_250._6_2_,CONCAT51(local_250._1_5_,local_250[0])) + 1);
            }
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e8._8_8_ !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) goto LAB_003701e1;
        if ((cmGeneratorExpressionDAGChecker *)local_e8._0_8_ !=
            (cmGeneratorExpressionDAGChecker *)(local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
        }
        ppVar9 = (thisTarget->OriginalLinkLibraries).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      item_00 = item_00 + 1;
    } while (item_00 != ppVar9);
  }
  return;
}

Assistant:

void
cmTargetInternals::ComputeLinkImplementationLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkImplementation& impl,
  cmTarget const* head) const
{
  // Collect libraries directly linked in this configuration.
  for (std::vector<cmValueWithOrigin>::const_iterator
      le = this->LinkImplementationPropertyEntries.begin(),
      end = this->LinkImplementationPropertyEntries.end();
      le != end; ++le)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        thisTarget->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(&le->Backtrace);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(le->Value);
    std::string const evaluated =
      cge->Evaluate(thisTarget->Makefile, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = thisTarget->CheckCMP0004(*li);
      if(name == thisTarget->GetName() || name.empty())
        {
        if(name == thisTarget->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(thisTarget->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << thisTarget->GetName() << "\" links to itself.";
            thisTarget->Makefile->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), thisTarget->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, thisTarget->FindTargetToLink(name),
                       le->Backtrace, evaluated != le->Value));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!thisTarget->GetProperty(*it))
        {
        thisTarget->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(thisTarget, thisTarget->MaxLanguageStandards);
    }

  cmTarget::LinkLibraryType linkType = thisTarget->ComputeLinkType(config);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    thisTarget->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != cmTarget::GENERAL && li->second != linkType)
      {
      std::string name = thisTarget->CheckCMP0004(li->first);
      if(name == thisTarget->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, thisTarget->FindTargetToLink(name)));
      }
    }
}